

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void icu_63::DecimalFormat::fieldPositionHelper
               (FormattedNumber *formatted,FieldPosition *fieldPosition,int32_t offset,
               UErrorCode *status)

{
  UBool UVar1;
  undefined1 local_48 [8];
  FieldPositionOnlyHandler fpoh;
  bool found;
  UErrorCode *status_local;
  int32_t offset_local;
  FieldPosition *fieldPosition_local;
  FormattedNumber *formatted_local;
  
  FieldPosition::setBeginIndex(fieldPosition,0);
  FieldPosition::setEndIndex(fieldPosition,0);
  UVar1 = icu_63::number::FormattedNumber::nextFieldPosition(formatted,fieldPosition,status);
  fpoh.pos._7_1_ = UVar1 != '\0';
  if (((bool)fpoh.pos._7_1_) && (offset != 0)) {
    FieldPositionOnlyHandler::FieldPositionOnlyHandler
              ((FieldPositionOnlyHandler *)local_48,fieldPosition);
    FieldPositionOnlyHandler::shiftLast((FieldPositionOnlyHandler *)local_48,offset);
    FieldPositionOnlyHandler::~FieldPositionOnlyHandler((FieldPositionOnlyHandler *)local_48);
  }
  return;
}

Assistant:

void
DecimalFormat::fieldPositionHelper(const number::FormattedNumber& formatted, FieldPosition& fieldPosition,
                                   int32_t offset, UErrorCode& status) {
    // always return first occurrence:
    fieldPosition.setBeginIndex(0);
    fieldPosition.setEndIndex(0);
    bool found = formatted.nextFieldPosition(fieldPosition, status);
    if (found && offset != 0) {
        FieldPositionOnlyHandler fpoh(fieldPosition);
        fpoh.shiftLast(offset);
    }
}